

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,UnicodeString *pattern,uint32_t options,SymbolTable *symbols,
          UErrorCode *status)

{
  int32_t iVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t local_5c [2];
  int32_t i;
  undefined1 local_48 [8];
  ParsePosition pos;
  UErrorCode *status_local;
  SymbolTable *symbols_local;
  uint32_t options_local;
  UnicodeString *pattern_local;
  UnicodeSet *this_local;
  
  pos._8_8_ = status;
  ParsePosition::ParsePosition((ParsePosition *)local_48,0);
  applyPattern(this,pattern,(ParsePosition *)local_48,options,symbols,(UErrorCode *)pos._8_8_);
  UVar2 = ::U_FAILURE(*(UErrorCode *)pos._8_8_);
  if (UVar2 == '\0') {
    local_5c[0] = ParsePosition::getIndex((ParsePosition *)local_48);
    if ((options & 1) != 0) {
      ICU_Utility::skipWhitespace(pattern,local_5c,'\x01');
    }
    iVar1 = local_5c[0];
    iVar3 = UnicodeString::length(pattern);
    if (iVar1 != iVar3) {
      *(undefined4 *)pos._8_8_ = 1;
    }
  }
  local_5c[1] = 1;
  ParsePosition::~ParsePosition((ParsePosition *)local_48);
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                                     uint32_t options,
                                     const SymbolTable* symbols,
                                     UErrorCode& status) {
    ParsePosition pos(0);
    applyPattern(pattern, pos, options, symbols, status);
    if (U_FAILURE(status)) return *this;

    int32_t i = pos.getIndex();

    if (options & USET_IGNORE_SPACE) {
        // Skip over trailing whitespace
        ICU_Utility::skipWhitespace(pattern, i, TRUE);
    }

    if (i != pattern.length()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}